

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFSystemError.hh
# Opt level: O3

void __thiscall QPDFSystemError::~QPDFSystemError(QPDFSystemError *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR__QPDFSystemError_002ef138;
  pcVar2 = (this->description)._M_dataplus._M_p;
  paVar1 = &(this->description).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

~QPDFSystemError() noexcept override = default;